

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O3

string * hostsPath_abi_cxx11_(void)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  configDir_abi_cxx11_();
  path<std::__cxx11::string,char_const*>(in_RDI,&local_30,"hosts");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

std::string hostsPath() {
    return path(configDir(), "hosts");
}